

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O3

void swrenderer::R_DrawMaskedSingle(bool renew)

{
  vissprite_t *spr;
  long lVar1;
  drawseg_t *pdVar2;
  int iVar3;
  drawseg_t *pdVar4;
  drawseg_t *ds;
  long lVar5;
  
  if (0 < (long)vsprcount) {
    lVar5 = (long)vsprcount + 1;
    lVar1 = spritesorter;
    iVar3 = CurrentPortalUniq;
    do {
      spr = *(vissprite_t **)(lVar1 + -0x10 + lVar5 * 8);
      if (spr->CurrentPortalUniq == iVar3) {
        R_DrawSprite(spr);
        lVar1 = spritesorter;
        iVar3 = CurrentPortalUniq;
      }
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  if (renew) {
    fake3D = fake3D | 4;
  }
  pdVar2 = firstdrawseg;
  pdVar4 = ds_p;
  iVar3 = CurrentPortalUniq;
  if (firstdrawseg < ds_p) {
    do {
      ds = pdVar4 + -1;
      if (((pdVar4[-1].CurrentPortalUniq == iVar3) && (pdVar4[-1].fake == 0)) &&
         ((pdVar4[-1].maskedtexturecol != -1 || (pdVar4[-1].bFogBoundary != '\0')))) {
        R_RenderMaskedSegRange(ds,(int)pdVar4[-1].x1,(int)pdVar4[-1].x2);
        pdVar2 = firstdrawseg;
        iVar3 = CurrentPortalUniq;
      }
      pdVar4 = ds;
    } while (pdVar2 < ds);
  }
  return;
}

Assistant:

void R_DrawMaskedSingle (bool renew)
{
	drawseg_t *ds;
	int i;

#if 0
	R_SplitVisSprites ();
#endif

	for (i = vsprcount; i > 0; i--)
	{
		if (spritesorter[i-1]->CurrentPortalUniq != CurrentPortalUniq)
			continue; // probably another time
		R_DrawSprite (spritesorter[i-1]);
	}

	// render any remaining masked mid textures

	// Modified by Lee Killough:
	// (pointer check was originally nonportable
	// and buggy, by going past LEFT end of array):

	//		for (ds=ds_p-1 ; ds >= drawsegs ; ds--)    old buggy code

	if (renew)
	{
		fake3D |= FAKE3D_REFRESHCLIP;
	}
	for (ds = ds_p; ds-- > firstdrawseg; )	// new -- killough
	{
		// [ZZ] the same as above
		if (ds->CurrentPortalUniq != CurrentPortalUniq)
			continue;
		// kg3D - no fake segs
		if (ds->fake) continue;
		if (ds->maskedtexturecol != -1 || ds->bFogBoundary)
		{
			R_RenderMaskedSegRange (ds, ds->x1, ds->x2);
		}
	}
}